

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O2

void __thiscall
arma::Mat<double>::
Mat<arma::Mat<double>,arma::Glue<arma::Mat<double>,arma::eGlue<arma::Op<arma::Col<double>,arma::op_repmat>,arma::Mat<double>,arma::eglue_minus>,arma::glue_times>,arma::eglue_plus>
          (Mat<double> *this,
          eGlue<arma::Mat<double>,_arma::Glue<arma::Mat<double>,_arma::eGlue<arma::Op<arma::Col<double>,_arma::op_repmat>,_arma::Mat<double>,_arma::eglue_minus>,_arma::glue_times>,_arma::eglue_plus>
          *X)

{
  Mat<double> *pMVar1;
  uword uVar2;
  
  pMVar1 = (X->P1).Q;
  uVar2 = pMVar1->n_cols;
  this->n_rows = pMVar1->n_rows;
  this->n_cols = uVar2;
  this->n_elem = pMVar1->n_elem;
  this->mem = (double *)0x0;
  this->n_alloc = 0;
  this->vec_state = 0;
  this->mem_state = 0;
  init_cold(this);
  eglue_core<arma::eglue_plus>::
  apply<arma::Mat<double>,arma::Mat<double>,arma::Glue<arma::Mat<double>,arma::eGlue<arma::Op<arma::Col<double>,arma::op_repmat>,arma::Mat<double>,arma::eglue_minus>,arma::glue_times>>
            (this,X);
  return;
}

Assistant:

inline
Mat<eT>::Mat(const eGlue<T1, T2, eglue_type>& X)
  : n_rows(X.get_n_rows())
  , n_cols(X.get_n_cols())
  , n_elem(X.get_n_elem())
  , n_alloc()
  , vec_state(0)
  , mem_state(0)
  , mem()
  {
  arma_debug_sigprint_this(this);
  
  arma_type_check(( is_same_type< eT, typename T1::elem_type >::no ));
  arma_type_check(( is_same_type< eT, typename T2::elem_type >::no ));
  
  init_cold();
  
  eglue_type::apply(*this, X);
  }